

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient3dfast(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *pd;
  dVar2 = pd[1];
  dVar3 = pd[2];
  return ((pb[2] - dVar3) * (pa[1] - dVar2) - (pa[2] - dVar3) * (pb[1] - dVar2)) * (*pc - dVar1) +
         ((pc[1] - dVar2) * (pa[2] - dVar3) - (pc[2] - dVar3) * (pa[1] - dVar2)) * (*pb - dVar1) +
         ((pb[1] - dVar2) * (pc[2] - dVar3) - (pc[1] - dVar2) * (pb[2] - dVar3)) * (*pa - dVar1);
}

Assistant:

REAL orient3dfast(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx;
  REAL ady, bdy, cdy;
  REAL adz, bdz, cdz;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];
  adz = pa[2] - pd[2];
  bdz = pb[2] - pd[2];
  cdz = pc[2] - pd[2];

  return adx * (bdy * cdz - bdz * cdy)
       + bdx * (cdy * adz - cdz * ady)
       + cdx * (ady * bdz - adz * bdy);
}